

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O0

Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient> __thiscall
kj::
refcounted<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,kj::(anonymous_namespace)::NetworkAddressHttpClient&,kj::Own<kj::(anonymous_namespace)::HttpClientImpl>>
          (kj *this,NetworkAddressHttpClient *params,
          Own<kj::(anonymous_namespace)::HttpClientImpl> *params_1)

{
  RefcountedClient *this_00;
  NetworkAddressHttpClient *parent;
  Own<kj::(anonymous_namespace)::HttpClientImpl> *other;
  RefcountedClient *extraout_RDX;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient> OVar1;
  Own<kj::(anonymous_namespace)::HttpClientImpl> local_30;
  Own<kj::(anonymous_namespace)::HttpClientImpl> *local_20;
  Own<kj::(anonymous_namespace)::HttpClientImpl> *params_local_1;
  NetworkAddressHttpClient *params_local;
  
  local_20 = params_1;
  params_local_1 = (Own<kj::(anonymous_namespace)::HttpClientImpl> *)params;
  params_local = (NetworkAddressHttpClient *)this;
  this_00 = (RefcountedClient *)operator_new(0x28);
  parent = fwd<kj::(anonymous_namespace)::NetworkAddressHttpClient&>
                     ((NetworkAddressHttpClient *)params_local_1);
  other = fwd<kj::Own<kj::(anonymous_namespace)::HttpClientImpl>>(local_20);
  Own<kj::(anonymous_namespace)::HttpClientImpl>::Own(&local_30,other);
  anon_unknown_31::NetworkAddressHttpClient::RefcountedClient::RefcountedClient
            (this_00,parent,&local_30);
  Refcounted::addRefInternal<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>
            ((Refcounted *)this,this_00);
  Own<kj::(anonymous_namespace)::HttpClientImpl>::~Own(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

inline Own<T> refcounted(Params&&... params) {
  // Allocate a new refcounted instance of T, passing `params` to its constructor.  Returns an
  // initial reference to the object.  More references can be created with `kj::addRef()`.

  return Refcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}